

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

dataid MetaFindParam(node *p,tchar_t *Token)

{
  bool_t bVar1;
  uint *puVar2;
  long lVar3;
  
  if (Token != (tchar_t *)0x0) {
    lVar3 = (long)p->VMT + -0x48;
    do {
      puVar2 = *(uint **)(lVar3 + 8);
      if (puVar2 != (uint *)0x0) {
        do {
          if ((char)*puVar2 == '\x1e') {
            bVar1 = tcsisame_ascii(Token,*(tchar_t **)(puVar2 + 2));
            if (bVar1 != 0) {
              return (ulong)(*puVar2 >> 8);
            }
          }
          else if ((char)*puVar2 == '\0') break;
          puVar2 = puVar2 + 4;
        } while( true );
      }
      lVar3 = *(long *)(lVar3 + 0x18);
    } while (lVar3 != 0);
  }
  return 0;
}

Assistant:

static dataid MetaFindParam(node* p,const tchar_t* Token)
{
    if (Token)
    {
        const nodeclass* c;
        const nodemeta* m;

        for (c = NodeGetClass(p);c;c=c->ParentClass)
            if (c->Meta) // should be registered, just fail safe
                for (m=c->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                    if (m->Meta == META_PARAM_NAME && tcsisame_ascii(Token,(const tchar_t*)m->Data))
                    {
                        return m->Id;
                    }
    }
    return 0;
}